

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O1

int Gia_SplitCofVar2(Gia_Man_t *p,int *pnFanouts,int *pnCost)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  
  if (p->pRefs == (int *)0x0) {
    Gia_ManCreateRefs(p);
  }
  pVVar3 = p->vCis;
  uVar1 = pVVar3->nSize;
  uVar6 = uVar1 - p->nRegs;
  if (uVar6 == 0 || (int)uVar1 < p->nRegs) {
    uVar4 = 0xffffffff;
  }
  else {
    uVar7 = 0;
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    iVar9 = -1;
    uVar5 = 0xffffffff;
    do {
      uVar4 = (uint)uVar5;
      if (uVar8 == uVar7) goto LAB_0065923b;
      iVar2 = pVVar3->pArray[uVar7];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_0065921c;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      iVar2 = p->pRefs[iVar2];
      if (iVar9 < iVar2) {
        uVar5 = uVar7 & 0xffffffff;
      }
      uVar4 = (uint)uVar5;
      if (iVar9 <= iVar2) {
        iVar9 = iVar2;
      }
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  if ((int)uVar4 < 0) {
    __assert_fail("iBest >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSplit.c"
                  ,0xdd,"int Gia_SplitCofVar2(Gia_Man_t *, int *, int *)");
  }
  if ((int)uVar6 <= (int)uVar4) {
    __assert_fail("v < Gia_ManPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
  }
  if ((int)uVar4 < (int)uVar1) {
    iVar9 = pVVar3->pArray[uVar4];
    if ((-1 < (long)iVar9) && (iVar9 < p->nObjs)) {
      *pnFanouts = p->pRefs[iVar9];
      *pnCost = -1;
      return uVar4;
    }
LAB_0065921c:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_0065923b:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Gia_SplitCofVar2( Gia_Man_t * p, int * pnFanouts, int * pnCost )
{
    Gia_Obj_t * pObj;
    int i, iBest = -1, CostBest = -1;
    if ( p->pRefs == NULL )
        Gia_ManCreateRefs( p );
    Gia_ManForEachPi( p, pObj, i )
        if ( CostBest < Gia_ObjRefNum(p, pObj) )
            iBest = i, CostBest = Gia_ObjRefNum(p, pObj);
    assert( iBest >= 0 );
    *pnFanouts = Gia_ObjRefNum(p, Gia_ManPi(p, iBest));
    *pnCost = -1;
    return iBest;
}